

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O3

void __thiscall AAmbientSound::Tick(AAmbientSound *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  uint uVar7;
  uint uVar8;
  float volume;
  float fVar9;
  FSoundID local_20;
  FSoundID local_1c;
  
  AActor::Tick(&this->super_AActor);
  if (((this->super_AActor).field_0x4bc == '\x01') && (this->NextCheck <= level.maptime)) {
    uVar7 = (this->super_AActor).args[0];
    pNVar5 = Ambients.Nodes + (Ambients.Size - 1 & uVar7);
    do {
      pNVar6 = pNVar5;
      if (pNVar6 == (Node *)0x0) {
        return;
      }
      if (pNVar6->Next == (Node *)0x1) {
        return;
      }
      pNVar5 = pNVar6->Next;
    } while ((pNVar6->Pair).Key != uVar7);
    iVar1 = (pNVar6->Pair).Value.sound.ID;
    uVar7 = (pNVar6->Pair).Value.type & 3;
    if (iVar1 == 0) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this,0);
      return;
    }
    iVar2 = (this->super_AActor).args[1];
    iVar3 = (this->super_AActor).args[2];
    fVar9 = 1.0;
    if (iVar2 != 0) {
      fVar9 = (float)iVar2 * 0.01;
    }
    uVar8 = (uint)(uVar7 == 3) << 8;
    fVar9 = fVar9 * (pNVar6->Pair).Value.volume;
    if (1.0 <= fVar9) {
      fVar9 = 1.0;
    }
    volume = 0.0;
    if (0.0 <= fVar9) {
      volume = fVar9;
    }
    iVar2 = (this->super_AActor).args[3];
    if (iVar2 < iVar3 || iVar2 == 0 && iVar3 == 0) {
      local_1c.ID = iVar1;
      S_Sound(&this->super_AActor,uVar8 | 4,&local_1c,volume,(pNVar6->Pair).Value.attenuation);
    }
    else {
      iVar4 = (this->super_AActor).args[4];
      if (iVar4 < 1) {
        fVar9 = 1.0;
      }
      else {
        fVar9 = (float)iVar4;
      }
      local_20.ID = iVar1;
      S_SoundMinMaxDist(&this->super_AActor,uVar8 | 4,&local_20,volume,(float)iVar3 * fVar9,
                        (float)iVar2 * fVar9);
    }
    if (uVar7 == 3) {
      this->NextCheck = 0x7fffffff;
    }
    else {
      SetTicker(this,&(pNVar6->Pair).Value);
    }
  }
  return;
}

Assistant:

void AAmbientSound::Tick ()
{
	Super::Tick ();

	if (!bActive || level.maptime < NextCheck)
		return;

	FAmbientSound *ambient;
	int loop = 0;

	ambient = Ambients.CheckKey(args[0]);
	if (ambient == NULL)
	{
		return;
	}

	if ((ambient->type & CONTINUOUS) == CONTINUOUS)
	{
		loop = CHAN_LOOP;
	}

	if (ambient->sound != FSoundID(0))
	{
		// The second argument scales the ambient sound's volume.
		// 0 and 100 are normal volume. The maximum volume level
		// possible is always 1.
		float volscale = args[1] == 0 ? 1 : args[1] / 100.f;
		float usevol = clamp(ambient->volume * volscale, 0.f, 1.f);

		// The third argument is the minimum distance for audible fading, and
		// the fourth argument is the maximum distance for audibility. Setting
		// either of these to 0 or setting  min distance > max distance will
		// use the standard rolloff.
		if ((args[2] | args[3]) == 0 || args[2] > args[3])
		{
			S_Sound(this, CHAN_BODY | loop, ambient->sound, usevol, ambient->attenuation);
		}
		else
		{
			float min = float(args[2]), max = float(args[3]);
			// The fifth argument acts as a scalar for the preceding two, if it's non-zero.
			if (args[4] > 0)
			{
				min *= args[4];
				max *= args[4];
			}
			S_SoundMinMaxDist(this, CHAN_BODY | loop, ambient->sound, usevol, min, max);
		}
		if (!loop)
		{
			SetTicker (ambient);
		}
		else
		{
			NextCheck = INT_MAX;
		}
	}
	else
	{
		Destroy ();
	}
}